

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O2

Npn_Man_t * Npn_ManStart(char *pFileName)

{
  int iVar1;
  int iVar2;
  Npn_Man_t *p;
  FILE *__stream;
  Npn_Obj_t *pNVar3;
  int *piVar4;
  
  p = (Npn_Man_t *)calloc(1,0x20);
  if (pFileName == (char *)0x0) {
    p->nBufferSize = 100;
    pNVar3 = (Npn_Obj_t *)malloc(0x640);
    p->pBuffer = pNVar3;
    iVar1 = Abc_PrimeCudd(0x32);
    p->nBins = iVar1;
    piVar4 = (int *)calloc((long)iVar1,4);
    p->pBins = piVar4;
    p->nEntries = 1;
  }
  else {
    __stream = fopen(pFileName,"r");
    if (__stream == (FILE *)0x0) {
      p = (Npn_Man_t *)0x0;
      Abc_Print(-1,"Cannot open NPN function file \"%s\".\n",pFileName);
    }
    else {
      fclose(__stream);
      iVar1 = Extra_FileSize(pFileName);
      iVar2 = (iVar1 / 0x14) * 4;
      p->nBufferSize = iVar2;
      pNVar3 = (Npn_Obj_t *)malloc((long)iVar2 << 4);
      p->pBuffer = pNVar3;
      iVar1 = Abc_PrimeCudd((iVar1 / 0x14) * 2);
      p->nBins = iVar1;
      piVar4 = (int *)calloc((long)iVar1,4);
      p->pBins = piVar4;
      p->nEntries = 1;
      Npn_ManRead(p,pFileName);
    }
  }
  return p;
}

Assistant:

Npn_Man_t * Npn_ManStart( char * pFileName )
{
    Npn_Man_t * p;
    p = ABC_CALLOC( Npn_Man_t, 1 );
    if ( pFileName == NULL )
    {
        p->nBufferSize = 1000000;
        p->nBufferSize = 100;
        p->pBuffer     = ABC_ALLOC( Npn_Obj_t, p->nBufferSize );
        p->nBins       = Abc_PrimeCudd( p->nBufferSize / 2 );
        p->pBins       = ABC_CALLOC( int, p->nBins );
        p->nEntries    = 1;
    }
    else
    {
        FILE * pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open NPN function file \"%s\".\n", pFileName );
            return NULL;
        }
        fclose( pFile );
        p->nBufferSize = 4 * ( Extra_FileSize(pFileName) / 20 );
        p->pBuffer     = ABC_ALLOC( Npn_Obj_t, p->nBufferSize );
        p->nBins       = Abc_PrimeCudd( p->nBufferSize / 2 );
        p->pBins       = ABC_CALLOC( int, p->nBins );
        p->nEntries    = 1;
        Npn_ManRead( p, pFileName );
    }
    return p;
}